

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O0

int available_fds(uint n)

{
  int iVar1;
  uint in_EDI;
  bool bVar2;
  int fds [256];
  int ret;
  uint i;
  int aiStack_418 [258];
  int local_10;
  uint local_c;
  uint local_8;
  int local_4;
  
  if (in_EDI < 0x101) {
    local_10 = 0;
    local_8 = in_EDI;
    for (local_c = 0; local_c < local_8; local_c = local_c + 1) {
      aiStack_418[local_c] = -1;
      iVar1 = socket(2,2,0);
      aiStack_418[local_c] = iVar1;
      if (iVar1 < 0) {
        local_10 = 1;
        break;
      }
    }
    local_c = 0;
    while( true ) {
      bVar2 = false;
      if (local_c < local_8) {
        bVar2 = -1 < aiStack_418[local_c];
      }
      if (!bVar2) break;
      close(aiStack_418[local_c]);
      local_c = local_c + 1;
    }
    local_4 = local_10;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int
available_fds(unsigned int n)
{
	unsigned int	i;
	int		ret, fds[256];

	if (n > (sizeof(fds)/sizeof(fds[0])))
		return (1);

	ret = 0;
	for (i = 0; i < n; i++) {
		fds[i] = -1;
		if ((fds[i] = socket(AF_INET, SOCK_DGRAM, 0)) < 0) {
			ret = 1;
			break;
		}
	}

	for (i = 0; i < n && fds[i] >= 0; i++)
		close(fds[i]);

	return (ret);
}